

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O3

void __thiscall
duckdb::ChangeOwnershipInfo::Serialize(ChangeOwnershipInfo *this,Serializer *serializer)

{
  AlterInfo::Serialize(&this->super_AlterInfo,serializer);
  (*serializer->_vptr_Serializer[2])(serializer,300,"entry_catalog_type");
  Serializer::WriteValue<duckdb::CatalogType>(serializer,(this->super_AlterInfo).field_0x71);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0x12d,"owner_schema",&this->owner_schema);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0x12e,"owner_name",&this->owner_name);
  return;
}

Assistant:

void ChangeOwnershipInfo::Serialize(Serializer &serializer) const {
	AlterInfo::Serialize(serializer);
	serializer.WriteProperty<CatalogType>(300, "entry_catalog_type", entry_catalog_type);
	serializer.WritePropertyWithDefault<string>(301, "owner_schema", owner_schema);
	serializer.WritePropertyWithDefault<string>(302, "owner_name", owner_name);
}